

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O0

void __thiscall
Sequence::process_cluster_list2
          (Sequence *this,shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *hdr1,int i,
          Eqclass_SS *EQ,shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *cluster,
          shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> *LargeL,int iter,int eqtype,
          Eqclass_S *parent)

{
  Env *seqstrm_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  element_type *peVar4;
  shared_ptr<Itemset> *psVar5;
  shared_ptr<Itemset> *psVar6;
  element_type *peVar7;
  reference pvVar8;
  element_type *peVar9;
  element_type *peVar10;
  __shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var11;
  element_type *peVar12;
  __shared_ptr_access<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var13;
  element_type *peVar14;
  element_type *peVar15;
  reference pvVar16;
  element_type *this_00;
  shared_ptr<Eqclass> local_180;
  shared_ptr<Eqclass> local_170;
  shared_ptr<Eqclass> local_160;
  shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> local_150;
  shared_ptr<Eqclass> local_140;
  ListNodes<std::shared_ptr<Itemset>_> local_130;
  shared_ptr<Itemset> local_110;
  shared_ptr<Itemset> local_100;
  undefined1 local_f0 [32];
  shared_ptr<Itemset> local_d0 [2];
  undefined1 local_b0 [28];
  int msup;
  int esup;
  int lsup;
  Itemset_S mjoin;
  Itemset_S ejoin;
  Itemset_S ljoin;
  shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> hdr2;
  int j;
  ostringstream *seqstrm;
  ostringstream *logger;
  shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> *LargeL_local;
  shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *cluster_local;
  Eqclass_SS *EQ_local;
  int i_local;
  shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *hdr1_local;
  Sequence *this_local;
  
  seqstrm_00 = this->env;
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::shared_ptr
            ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
             &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Itemset>::shared_ptr
            ((shared_ptr<Itemset> *)
             &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Itemset>::shared_ptr
            ((shared_ptr<Itemset> *)
             &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Itemset>::shared_ptr((shared_ptr<Itemset> *)&esup);
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::operator=
            ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
             &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,hdr1);
  hdr2.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = i;
  while (bVar1 = std::__shared_ptr::operator_cast_to_bool
                           ((__shared_ptr *)
                            &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount), bVar1) {
    peVar4 = std::
             __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)hdr1);
    psVar5 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
    peVar4 = std::
             __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
    psVar6 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
    peVar10 = std::
              __shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)EQ);
    p_Var11 = (__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                        (peVar10,(long)hdr2.
                                       super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi._4_4_);
    peVar12 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(p_Var11);
    uVar2 = Eqclass::templ(peVar12);
    prune_decision((Sequence *)local_b0,(Itemset_S *)this,psVar5,(uint)psVar6,uVar2);
    std::shared_ptr<Itemset>::operator=
              ((shared_ptr<Itemset> *)
               &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (shared_ptr<Itemset> *)local_b0);
    std::shared_ptr<Itemset>::~shared_ptr((shared_ptr<Itemset> *)local_b0);
    bVar1 = std::operator==((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
                            &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,hdr1);
    if (bVar1) {
      std::shared_ptr<Itemset>::shared_ptr(local_d0,(nullptr_t)0x0);
      psVar5 = std::shared_ptr<Itemset>::operator=((shared_ptr<Itemset> *)&esup,local_d0);
      std::shared_ptr<Itemset>::operator=
                ((shared_ptr<Itemset> *)
                 &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,psVar5);
      std::shared_ptr<Itemset>::~shared_ptr(local_d0);
    }
    else {
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
      psVar5 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)hdr1);
      psVar6 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      peVar10 = std::
                __shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)EQ);
      p_Var11 = (__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::
                at(peVar10,(long)i);
      peVar12 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      uVar2 = Eqclass::templ2(peVar12);
      prune_decision((Sequence *)(local_f0 + 0x10),(Itemset_S *)this,psVar5,(uint)psVar6,uVar2);
      std::shared_ptr<Itemset>::operator=
                ((shared_ptr<Itemset> *)
                 &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (shared_ptr<Itemset> *)(local_f0 + 0x10));
      std::shared_ptr<Itemset>::~shared_ptr((shared_ptr<Itemset> *)(local_f0 + 0x10));
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
      psVar5 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)hdr1);
      psVar6 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      peVar10 = std::
                __shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)EQ);
      p_Var11 = (__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::
                at(peVar10,(long)i);
      peVar12 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      uVar2 = Eqclass::templ(peVar12);
      prune_decision((Sequence *)local_f0,(Itemset_S *)this,psVar5,(uint)psVar6,uVar2);
      std::shared_ptr<Itemset>::operator=
                ((shared_ptr<Itemset> *)&esup,(shared_ptr<Itemset> *)local_f0);
      std::shared_ptr<Itemset>::~shared_ptr((shared_ptr<Itemset> *)local_f0);
    }
    local_b0._20_4_ = 0;
    local_b0._24_4_ = 0;
    msup = 0;
    peVar15 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->args);
    if (1 < peVar15->pruning_type) {
      peVar10 = std::
                __shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)EQ);
      p_Var11 = (__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::
                at(peVar10,(long)i);
      peVar12 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      uVar2 = Eqclass::templ2(peVar12);
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)hdr1);
      psVar5 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
      psVar6 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      pre_pruning(this,(Itemset_S *)
                       &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                  uVar2,psVar5,psVar6,'\0');
      peVar10 = std::
                __shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)EQ);
      p_Var11 = (__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::
                at(peVar10,(long)hdr2.
                                 super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._4_4_);
      peVar12 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      uVar2 = Eqclass::templ(peVar12);
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
      psVar5 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)hdr1);
      psVar6 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      pre_pruning(this,(Itemset_S *)
                       &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                  uVar2,psVar5,psVar6,'\x01');
      peVar10 = std::
                __shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)EQ);
      p_Var11 = (__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::
                at(peVar10,(long)i);
      peVar12 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      uVar2 = Eqclass::templ(peVar12);
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)hdr1);
      psVar5 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
      psVar6 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      pre_pruning(this,(Itemset_S *)&esup,uVar2,psVar5,psVar6,'\x01');
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (((bVar1) ||
        (bVar1 = std::__shared_ptr::operator_cast_to_bool
                           ((__shared_ptr *)
                            &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount), bVar1)) ||
       (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&esup), bVar1)) {
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)hdr1);
      psVar5 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
      psVar6 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      get_tmpnewf_intersect
                (this,(Itemset_S *)
                      &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (Itemset_S *)
                 &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (Itemset_S *)&esup,&msup,(int *)(local_b0 + 0x18),(int *)(local_b0 + 0x14),psVar5,
                 psVar6,iter);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
      psVar5 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)hdr1);
      psVar6 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      fill_join(this,(Itemset_S *)
                     &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                psVar5,psVar6);
    }
    peVar15 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->args);
    if (1 < peVar15->pruning_type) {
      peVar10 = std::
                __shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)EQ);
      p_Var11 = (__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::
                at(peVar10,(long)hdr2.
                                 super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._4_4_);
      peVar12 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      uVar2 = Eqclass::templ(peVar12);
      post_pruning(this,(Itemset_S *)
                        &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   uVar2);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (bVar1) {
      peVar7 = std::
               __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->numLargeItemset);
      pvVar8 = std::vector<int,_std::allocator<int>_>::at(peVar7,(long)(iter + -1));
      *pvVar8 = *pvVar8 + 1;
      peVar15 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->args);
      if (peVar15->outputfreq != '\0') {
        peVar9 = std::__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
        peVar10 = std::
                  __shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)EQ);
        p_Var11 = (__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  ::at(peVar10,(long)hdr2.
                                     super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi._4_4_);
        peVar12 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(p_Var11);
        uVar2 = Eqclass::templ(peVar12);
        Itemset::print_seq(peVar9,(ostream *)seqstrm_00,uVar2);
      }
      peVar10 = std::
                __shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)EQ);
      p_Var11 = (__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::
                at(peVar10,(long)hdr2.
                                 super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._4_4_);
      peVar12 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      std::shared_ptr<Itemset>::shared_ptr
                (&local_100,
                 (shared_ptr<Itemset> *)
                 &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      Eqclass::append(peVar12,&local_100);
      std::shared_ptr<Itemset>::~shared_ptr(&local_100);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)hdr1);
      psVar5 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
      psVar6 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      fill_join(this,(Itemset_S *)
                     &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                psVar5,psVar6);
    }
    peVar15 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->args);
    if (1 < peVar15->pruning_type) {
      peVar10 = std::
                __shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)EQ);
      p_Var11 = (__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::
                at(peVar10,(long)i);
      peVar12 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      uVar2 = Eqclass::templ2(peVar12);
      post_pruning(this,(Itemset_S *)
                        &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   uVar2);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (bVar1) {
      peVar7 = std::
               __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->numLargeItemset);
      pvVar8 = std::vector<int,_std::allocator<int>_>::at(peVar7,(long)(iter + -1));
      *pvVar8 = *pvVar8 + 1;
      peVar15 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->args);
      if (peVar15->outputfreq != '\0') {
        peVar9 = std::__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
        peVar10 = std::
                  __shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)EQ);
        p_Var11 = (__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  ::at(peVar10,(long)i);
        peVar12 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(p_Var11);
        uVar2 = Eqclass::templ2(peVar12);
        Itemset::print_seq(peVar9,(ostream *)seqstrm_00,uVar2);
      }
      peVar10 = std::
                __shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)EQ);
      p_Var11 = (__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::
                at(peVar10,(long)i);
      peVar12 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      std::shared_ptr<Itemset>::shared_ptr
                (&local_110,
                 (shared_ptr<Itemset> *)
                 &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      Eqclass::append2(peVar12,&local_110);
      std::shared_ptr<Itemset>::~shared_ptr(&local_110);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&esup);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)hdr1);
      psVar5 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
      psVar6 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      fill_join(this,(Itemset_S *)&esup,psVar5,psVar6);
    }
    peVar15 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->args);
    if (1 < peVar15->pruning_type) {
      peVar10 = std::
                __shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)EQ);
      p_Var11 = (__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::
                at(peVar10,(long)i);
      peVar12 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      uVar2 = Eqclass::templ(peVar12);
      post_pruning(this,(Itemset_S *)&esup,uVar2);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&esup);
    if (bVar1) {
      peVar7 = std::
               __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->numLargeItemset);
      pvVar8 = std::vector<int,_std::allocator<int>_>::at(peVar7,(long)(iter + -1));
      *pvVar8 = *pvVar8 + 1;
      peVar15 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->args);
      if (peVar15->outputfreq != '\0') {
        peVar9 = std::__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&esup);
        peVar10 = std::
                  __shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)EQ);
        p_Var11 = (__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  ::at(peVar10,(long)i);
        peVar12 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(p_Var11);
        uVar2 = Eqclass::templ(peVar12);
        Itemset::print_seq(peVar9,(ostream *)seqstrm_00,uVar2);
      }
      peVar10 = std::
                __shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)EQ);
      p_Var11 = (__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::
                at(peVar10,(long)i);
      peVar12 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var11);
      std::shared_ptr<Itemset>::shared_ptr(&local_130.theItem,(shared_ptr<Itemset> *)&esup);
      Eqclass::append(peVar12,&local_130.theItem);
      std::shared_ptr<Itemset>::~shared_ptr(&local_130.theItem);
    }
    hdr2.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ =
         hdr2.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._4_4_ + 1;
    std::
    __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ListNodes<std::shared_ptr<Itemset>_>::next(&local_130);
    std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::operator=
              ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
               &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_130.theNext);
    std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::~shared_ptr(&local_130.theNext);
  }
  peVar10 = std::
            __shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)EQ);
  p_Var11 = (__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                      (peVar10,(long)i);
  peVar12 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      (p_Var11);
  p_Var13 = (__shared_ptr_access<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)Eqclass::list(peVar12);
  peVar14 = std::
            __shared_ptr_access<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->(p_Var13);
  iVar3 = Lists<std::shared_ptr<Itemset>_>::size(peVar14);
  if (iVar3 < 1) {
    peVar10 = std::
              __shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)EQ);
    p_Var11 = (__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                        (peVar10,(long)i);
    peVar12 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(p_Var11);
    p_Var13 = (__shared_ptr_access<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)Eqclass::list2(peVar12);
    peVar14 = std::
              __shared_ptr_access<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(p_Var13);
    iVar3 = Lists<std::shared_ptr<Itemset>_>::size(peVar14);
    if (iVar3 < 1) {
      std::shared_ptr<Eqclass>::shared_ptr(&local_180,(nullptr_t)0x0);
      peVar10 = std::
                __shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)EQ);
      pvVar16 = std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::
                at(peVar10,(long)i);
      std::shared_ptr<Eqclass>::operator=(pvVar16,&local_180);
      std::shared_ptr<Eqclass>::~shared_ptr(&local_180);
      goto LAB_0010d6b7;
    }
  }
  peVar15 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->args);
  if (peVar15->recursive == 0) {
    this_00 = std::
              __shared_ptr_access<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)LargeL);
    peVar10 = std::
              __shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)EQ);
    pvVar16 = std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                        (peVar10,(long)i);
    std::shared_ptr<Eqclass>::shared_ptr(&local_170,pvVar16);
    Lists<std::shared_ptr<Eqclass>_>::append(this_00,&local_170);
    std::shared_ptr<Eqclass>::~shared_ptr(&local_170);
  }
  else {
    peVar10 = std::
              __shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)EQ);
    pvVar16 = std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                        (peVar10,(long)i);
    std::shared_ptr<Eqclass>::shared_ptr(&local_140,pvVar16);
    std::shared_ptr<Lists<std::shared_ptr<Eqclass>_>_>::shared_ptr(&local_150,(nullptr_t)0x0);
    process_cluster1(this,&local_140,&local_150,iter + 1);
    std::shared_ptr<Lists<std::shared_ptr<Eqclass>_>_>::~shared_ptr(&local_150);
    std::shared_ptr<Eqclass>::~shared_ptr(&local_140);
    std::shared_ptr<Eqclass>::shared_ptr(&local_160,(nullptr_t)0x0);
    peVar10 = std::
              __shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)EQ);
    pvVar16 = std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                        (peVar10,(long)i);
    std::shared_ptr<Eqclass>::operator=(pvVar16,&local_160);
    std::shared_ptr<Eqclass>::~shared_ptr(&local_160);
  }
LAB_0010d6b7:
  std::shared_ptr<Itemset>::~shared_ptr((shared_ptr<Itemset> *)&esup);
  std::shared_ptr<Itemset>::~shared_ptr
            ((shared_ptr<Itemset> *)
             &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Itemset>::~shared_ptr
            ((shared_ptr<Itemset> *)
             &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::~shared_ptr
            ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
             &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void Sequence::process_cluster_list2(shared_ptr<ListNodes<shared_ptr<Itemset>>>& hdr1, int i, Eqclass_SS& EQ,
                                     shared_ptr<Lists<shared_ptr<Itemset>>>& cluster,
                                     shared_ptr<Lists<Eqclass_S>>& LargeL,
                                     int iter, int eqtype, Eqclass_S& parent) {
    ostringstream &logger = env.logger;
    ostringstream &seqstrm = env.seqstrm;

    int j;
    shared_ptr<ListNodes<shared_ptr<Itemset>>> hdr2;
    Itemset_S ljoin, ejoin, mjoin;
    int lsup, esup, msup;

    //join with sequences
    hdr2 = hdr1;
    for (j = i; hdr2; j++, hdr2 = hdr2->next()) {
        ljoin = prune_decision(hdr1->item(), hdr2->item(), EQ->at(j)->templ(), LJOIN);
        if (hdr2 == hdr1) {
            ejoin = mjoin = nullptr;
        } else {
            ejoin = prune_decision(hdr2->item(), hdr1->item(), EQ->at(i)->templ2(), EJOIN);
            mjoin = prune_decision(hdr2->item(), hdr1->item(), EQ->at(i)->templ(), MJOIN);
            //ejoin = mjoin = (Itemset_S )1;
        }
        lsup = esup = msup = 0;
        if (args->pruning_type > 1) {
            pre_pruning(ejoin, EQ->at(i)->templ2(), hdr1->item(), hdr2->item(), 0);
            pre_pruning(ljoin, EQ->at(j)->templ(), hdr2->item(), hdr1->item(), 1);
            pre_pruning(mjoin, EQ->at(i)->templ(), hdr1->item(), hdr2->item(), 1);
        }

        if (ljoin || ejoin || mjoin) get_tmpnewf_intersect(ljoin, ejoin, mjoin, lsup, esup, msup, hdr1->item(), hdr2->item(), iter);
        if (ljoin) fill_join(ljoin, hdr2->item(), hdr1->item());
        if (args->pruning_type > 1) post_pruning(ljoin, EQ->at(j)->templ());
        if (ljoin) {
            numLargeItemset->at(iter - 1)++;
            //fill_join(ljoin, hdr2->item(), hdr1->item());
            if (args->outputfreq) ljoin->print_seq(seqstrm, EQ->at(j)->templ());
            EQ->at(j)->append(ljoin);
        }

        if (ejoin) fill_join(ejoin, hdr1->item(), hdr2->item());
        if (args->pruning_type > 1) post_pruning(ejoin, EQ->at(i)->templ2());
        if (ejoin) {
            numLargeItemset->at(iter - 1)++;
            //fill_join(ejoin, hdr1->item(), hdr2->item());
            if (args->outputfreq) ejoin->print_seq(seqstrm, EQ->at(i)->templ2());
            EQ->at(i)->append2(ejoin);
        }

        if (mjoin) fill_join(mjoin, hdr1->item(), hdr2->item());
        if (args->pruning_type > 1) post_pruning(mjoin, EQ->at(i)->templ());
        if (mjoin) {
            numLargeItemset->at(iter - 1)++;
            //fill_join(mjoin, hdr1->item(), hdr2->item());
            if (args->outputfreq) mjoin->print_seq(seqstrm, EQ->at(i)->templ());
            EQ->at(i)->append(mjoin);
        }
    }
    if ((EQ->at(i)->list()->size() > 0) || (EQ->at(i)->list2()->size() > 0)) {
        if (args->recursive) {
            //if (use_hash) insert_freqarray(EQ->at(i));
            process_cluster1(EQ->at(i), nullptr, iter + 1);
            EQ->at(i) = nullptr;
        } else LargeL->append(EQ->at(i));
    } else {
        EQ->at(i) = nullptr;
    }

}